

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

BayesianGameIdenticalPayoff *
BayesianGameIdenticalPayoff::GenerateRandomBG
          (BayesianGameIdenticalPayoff *__return_storage_ptr__,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *acs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *obs)

{
  int iVar1;
  size_t sVar2;
  Index jtype;
  ulong uVar3;
  uint uVar4;
  Index ja;
  ulong uVar5;
  vector<double,_std::allocator<double>_> typeProbs;
  double r;
  double local_70;
  void *local_68;
  iterator iStack_60;
  double *local_58;
  double local_50;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_48;
  
  uVar3 = 0;
  BayesianGameIdenticalPayoff(__return_storage_ptr__,nrAgents,acs,obs,false);
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)__return_storage_ptr__);
      if (sVar2 <= uVar5) break;
      rand();
      (*(__return_storage_ptr__->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                (__return_storage_ptr__->_m_utilFunction,uVar3,uVar5);
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  local_68 = (void *)0x0;
  iStack_60._M_current = (double *)0x0;
  local_58 = (double *)0x0;
  uVar3 = 0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    iVar1 = rand();
    local_48.
    super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    .c_ = (container_type *)((double)iVar1 / 2147483647.0);
    if (iStack_60._M_current == local_58) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_68,iStack_60,(double *)&local_48);
    }
    else {
      *iStack_60._M_current =
           (double)local_48.
                   super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                   .c_;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  uVar3 = 0;
  local_70 = 0.0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    local_70 = local_70 + *(double *)((long)local_68 + uVar3 * 8);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    uVar3 = (ulong)uVar4;
    if (sVar2 <= uVar3) break;
    local_50 = *(double *)((long)local_68 + uVar3 * 8) / local_70;
    if ((__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        _m_useSparse == true) {
      local_48.
      super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      .c_ = &(__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).
             super_BayesianGameBase._m_jTypeProbsSparse;
      local_48.i_ = uVar3;
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      ::set(&local_48,&local_50);
    }
    else {
      (__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      _m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = local_50;
    }
    uVar4 = uVar4 + 1;
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

BayesianGameIdenticalPayoff 
BayesianGameIdenticalPayoff::GenerateRandomBG(
            size_t nrAgents,
            std::vector<size_t> acs,
            std::vector<size_t> obs
        )
{
    BayesianGameIdenticalPayoff bgip(nrAgents, acs, obs);
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        for(Index ja = 0; ja < bgip.GetNrJointActions(); ja++)
        {
            double rn = (rand() - (0.5 * RAND_MAX)) / (RAND_MAX / 20.0);
            bgip.SetUtility(jtype, ja, rn );
        }

    //create random, normalized prob distr.
    vector<double> typeProbs;
    double sum = 0.0;
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
    {
        double r = ((double)rand()) / RAND_MAX;
        typeProbs.push_back(r);
    }
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        sum += typeProbs[jtype];
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        bgip.SetProbability(jtype, typeProbs[jtype] / sum );

    //bgip.Print();
    return(bgip);
}